

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_url.c
# Opt level: O1

int amqp_parse_url(char *url,amqp_connection_info *parsed)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *end;
  char *local_40;
  char *local_38;
  
  local_40 = url;
  iVar3 = strncmp(url,"amqp://",7);
  if (iVar3 != 0) {
    iVar3 = strncmp(url,"amqps://",8);
    if (iVar3 != 0) {
      return -8;
    }
    parsed->port = 0x1627;
    parsed->ssl = 1;
  }
  pcVar7 = url + (8 - (ulong)(parsed->ssl == 0));
  local_40 = pcVar7;
  cVar2 = find_delim(&local_40,1);
  pcVar6 = local_40;
  if (cVar2 == ':') {
    cVar2 = find_delim(&local_40,1);
    pcVar5 = pcVar6;
  }
  else {
    pcVar6 = (char *)0x0;
    pcVar5 = pcVar7;
  }
  pcVar1 = local_40;
  if (cVar2 == '@') {
    parsed->user = pcVar7;
    if (pcVar6 != (char *)0x0) {
      parsed->password = pcVar6;
    }
    cVar2 = find_delim(&local_40,1);
    pcVar6 = (char *)0x0;
    pcVar5 = pcVar1;
    pcVar7 = pcVar1;
  }
  pcVar1 = local_40;
  if (cVar2 == '[') {
    if (pcVar7 != pcVar5) {
      return -8;
    }
    if (*pcVar7 != '\0') {
      return -8;
    }
    cVar2 = find_delim(&local_40,0);
    pcVar7 = local_40;
    if (cVar2 != ']') {
      return -8;
    }
    parsed->host = pcVar1;
    cVar2 = find_delim(&local_40,1);
    if (*pcVar7 != '\0') {
      return -8;
    }
  }
  else if (*pcVar7 != '\0') {
    parsed->host = pcVar7;
  }
  pcVar7 = local_40;
  if (cVar2 == ':') {
    cVar2 = find_delim(&local_40,1);
    pcVar6 = pcVar7;
  }
  if (pcVar6 != (char *)0x0) {
    uVar4 = strtol(pcVar6,&local_38,10);
    if (((pcVar6 == local_38) || (*local_38 != '\0')) || (0xffff < uVar4)) {
      return -8;
    }
    parsed->port = (int)uVar4;
  }
  pcVar6 = local_40;
  if (cVar2 != '\0') {
    if (cVar2 != '/') {
      return -8;
    }
    cVar2 = find_delim(&local_40,1);
    if (cVar2 != '\0') {
      return -8;
    }
    parsed->vhost = pcVar6;
  }
  return 0;
}

Assistant:

int amqp_parse_url(char *url, struct amqp_connection_info *parsed)
{
  int res = AMQP_STATUS_BAD_URL;
  char delim;
  char *start;
  char *host;
  char *port = NULL;

  /* check the prefix */
  if (!strncmp(url, "amqp://", 7)) {
    /* do nothing */
  } else if (!strncmp(url, "amqps://", 8)) {
    parsed->port = 5671;
    parsed->ssl = 1;
  } else {
    goto out;
  }

  host = start = url += (parsed->ssl ? 8 : 7);
  delim = find_delim(&url, 1);

  if (delim == ':') {
    /* The colon could be introducing the port or the
       password part of the userinfo.  We don't know yet,
       so stash the preceding component. */
    port = start = url;
    delim = find_delim(&url, 1);
  }

  if (delim == '@') {
    /* What might have been the host and port were in fact
       the username and password */
    parsed->user = host;
    if (port) {
      parsed->password = port;
    }

    port = NULL;
    host = start = url;
    delim = find_delim(&url, 1);
  }

  if (delim == '[') {
    /* IPv6 address.  The bracket should be the first
       character in the host. */
    if (host != start || *host != 0) {
      goto out;
    }

    start = url;
    delim = find_delim(&url, 0);

    if (delim != ']') {
      goto out;
    }

    parsed->host = start;
    start = url;
    delim = find_delim(&url, 1);

    /* Closing bracket should be the last character in the
       host. */
    if (*start != 0) {
      goto out;
    }
  } else {
    /* If we haven't seen the host yet, this is it. */
    if (*host != 0) {
      parsed->host = host;
    }
  }

  if (delim == ':') {
    port = start = url;
    delim = find_delim(&url, 1);
  }

  if (port) {
    char *end;
    long portnum = strtol(port, &end, 10);

    if (port == end || *end != 0 || portnum < 0 || portnum > 65535) {
      goto out;
    }

    parsed->port = portnum;
  }

  if (delim == '/') {
    start = url;
    delim = find_delim(&url, 1);

    if (delim != 0) {
      goto out;
    }

    parsed->vhost = start;
    res = AMQP_STATUS_OK;
  } else if (delim == 0) {
    res = AMQP_STATUS_OK;
  }

  /* Any other delimiter is bad, and we will return
     AMQP_STATUS_BAD_AMQP_URL. */

out:
  return res;
}